

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffc2d(char *cval,double *dval,int *status)

{
  int local_ec;
  char local_e8 [4];
  int lval;
  char msg [81];
  char local_88 [8];
  char sval [81];
  char local_29;
  int *piStack_28;
  char dtype;
  int *status_local;
  double *dval_local;
  char *cval_local;
  
  if (*status < 1) {
    if (*cval == '\0') {
      *status = 0xcc;
      cval_local._4_4_ = 0xcc;
    }
    else {
      piStack_28 = status;
      status_local = (int *)dval;
      dval_local = (double *)cval;
      ffdtyp(cval,&local_29,status);
      if ((local_29 == 'I') || (local_29 == 'F')) {
        ffc2dd((char *)dval_local,(double *)status_local,piStack_28);
      }
      else if (local_29 == 'L') {
        ffc2ll((char *)dval_local,&local_ec,piStack_28);
        *(double *)status_local = (double)local_ec;
      }
      else if (local_29 == 'C') {
        ffc2s((char *)dval_local,local_88,piStack_28);
        ffc2dd(local_88,(double *)status_local,piStack_28);
      }
      else {
        *piStack_28 = 0x196;
      }
      if (*piStack_28 < 1) {
        cval_local._4_4_ = *piStack_28;
      }
      else {
        status_local[0] = 0;
        status_local[1] = 0;
        strcpy(local_e8,"Error in ffc2d evaluating string as a double: ");
        strncat(local_e8,(char *)dval_local,0x1e);
        ffpmsg(local_e8);
        cval_local._4_4_ = *piStack_28;
      }
    }
  }
  else {
    cval_local._4_4_ = *status;
  }
  return cval_local._4_4_;
}

Assistant:

int ffc2d(const char *cval,   /* I - string representation of the value */
          double *dval,       /* O - numerical value of the input string */
          int *status)        /* IO - error status */
/*
  convert formatted string to a double value, doing implicit
  datatype conversion if necessary
*/
{
    char dtype, sval[81], msg[81];
    int lval;
    
    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (cval[0] == '\0')
        return(*status = VALUE_UNDEFINED);  /* null value string */

    ffdtyp(cval, &dtype, status);     /* determine the datatype */

    if (dtype == 'I' || dtype == 'F')
        ffc2dd(cval, dval, status);
    else if (dtype == 'L')
    {
        ffc2ll(cval, &lval, status);
        *dval = (double) lval;
    }
    else if (dtype == 'C')
    {
        /* try reading the string as a number */
        ffc2s(cval, sval, status); 
        ffc2dd(sval, dval, status);
    }
    else 
        *status = BAD_DOUBLEKEY;

    if (*status > 0)
    {
            *dval = 0.;
            strcpy(msg,"Error in ffc2d evaluating string as a double: ");
            strncat(msg,cval,30);
            ffpmsg(msg);
            return(*status);
    }

    return(*status);
}